

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cc
# Opt level: O0

uint __thiscall
RigidBodyDynamics::Model::AddBody
          (Model *this,uint parent_id,SpatialTransform *joint_frame,Joint *joint,Body *body,
          string *body_name)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  reference pvVar4;
  size_type sVar5;
  reference pvVar6;
  reference ppCVar7;
  long lVar8;
  mapped_type *pmVar9;
  SpatialTransform *XT;
  ulong uVar10;
  reference pvVar11;
  double *v4;
  double *v3;
  double *v2;
  double *v1;
  double *v0;
  SpatialVector_t *this_00;
  ostream *poVar12;
  undefined8 uVar13;
  reference pvVar14;
  pointer ppVar15;
  long in_RCX;
  uint in_ESI;
  long in_RDI;
  string *in_R9;
  iterator type_iter;
  JointType current_joint_type;
  uint i_2;
  vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
  joint_types;
  ostringstream errormsg_1;
  SpatialRigidBodyInertia rbi;
  uint i_1;
  int mCustomJoint_joint_counter;
  int multdof3_joint_counter;
  uint prev_joint_index;
  ostringstream errormsg;
  uint i;
  uint custom_index;
  uint lambda_q_last;
  uint fbody_id;
  SpatialTransform movable_parent_transform;
  uint movable_parent_id;
  SpatialTransform *in_stack_fffffffffffff108;
  value_type *pvVar16;
  value_type *__x;
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>_>
  *other;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *other_00;
  value_type *__x_00;
  SpatialTransform *in_stack_fffffffffffff110;
  iterator in_stack_fffffffffffff118;
  vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
  *in_stack_fffffffffffff120;
  const_iterator in_stack_fffffffffffff128;
  SpatialTransform *in_stack_fffffffffffff130;
  key_type *in_stack_fffffffffffff148;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *in_stack_fffffffffffff150;
  ostringstream *this_01;
  double *in_stack_fffffffffffff168;
  double *in_stack_fffffffffffff170;
  double *in_stack_fffffffffffff178;
  double *in_stack_fffffffffffff180;
  double *in_stack_fffffffffffff188;
  SpatialVector_t *in_stack_fffffffffffff190;
  undefined4 in_stack_fffffffffffff1a0;
  value_type in_stack_fffffffffffff1a4;
  undefined4 in_stack_fffffffffffff1d8;
  uint in_stack_fffffffffffff1dc;
  Matrix3d *in_stack_fffffffffffff288;
  undefined4 in_stack_fffffffffffff290;
  uint in_stack_fffffffffffff294;
  vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
  *in_stack_fffffffffffff298;
  __normal_iterator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_*,_std::vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>_>
  local_cd0;
  JointType local_cc4;
  JointType local_cc0;
  pair<RigidBodyDynamics::JointType,_unsigned_int> local_cbc;
  uint local_cb4;
  vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
  local_cb0;
  undefined1 local_c91;
  ostringstream local_c70 [376];
  value_type local_af8;
  undefined8 local_af0;
  undefined8 local_ae8;
  undefined8 local_ae0;
  undefined8 local_ad8;
  undefined8 local_ad0;
  value_type local_a98 [3];
  value_type local_9e8 [3];
  undefined8 local_958;
  undefined8 local_950;
  undefined8 local_948;
  undefined8 local_940;
  undefined8 local_938;
  undefined8 local_930;
  value_type local_8f8 [2];
  string *in_stack_fffffffffffff770;
  Body *in_stack_fffffffffffff778;
  Joint *in_stack_fffffffffffff780;
  SpatialTransform *in_stack_fffffffffffff788;
  uint in_stack_fffffffffffff794;
  Model *in_stack_fffffffffffff798;
  string *in_stack_fffffffffffff868;
  Body *in_stack_fffffffffffff870;
  Joint *in_stack_fffffffffffff878;
  SpatialTransform *in_stack_fffffffffffff880;
  uint in_stack_fffffffffffff88c;
  Model *in_stack_fffffffffffff890;
  undefined8 local_768;
  undefined8 local_760;
  undefined8 local_758;
  undefined8 local_750;
  undefined8 local_748;
  undefined8 local_740;
  uint local_6a8;
  undefined4 local_6a4;
  int local_6a0;
  undefined4 local_69c;
  value_type local_4d8;
  uint local_46c;
  value_type local_468 [2];
  value_type local_408 [2];
  undefined1 local_399;
  ostringstream local_378 [376];
  _Self local_200;
  _Self local_1f8 [25];
  undefined4 local_12c;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  int local_104;
  uint local_100;
  uint local_fc;
  uint local_f8;
  uint local_f4;
  uint local_8c;
  string local_88 [48];
  string local_58 [48];
  long local_28;
  uint local_14;
  uint local_4;
  
  if (*(int *)(in_RCX + 8) == 0xd) {
    std::__cxx11::string::string(local_58,in_R9);
    uVar3 = AddBodyFixedJoint(in_stack_fffffffffffff890,in_stack_fffffffffffff88c,
                              in_stack_fffffffffffff880,in_stack_fffffffffffff878,
                              in_stack_fffffffffffff870,in_stack_fffffffffffff868);
    *(uint *)(in_RDI + 0x54) = uVar3;
    std::__cxx11::string::~string(local_58);
    return *(uint *)(in_RDI + 0x54);
  }
  if (((((*(int *)(in_RCX + 8) != 6) && (*(int *)(in_RCX + 8) != 7)) && (*(int *)(in_RCX + 8) != 8))
      && (((*(int *)(in_RCX + 8) != 9 && (*(int *)(in_RCX + 8) != 10)) &&
          ((*(int *)(in_RCX + 8) != 0xb &&
           ((*(int *)(in_RCX + 8) != 0x15 && (*(int *)(in_RCX + 8) != 2)))))))) &&
     ((*(int *)(in_RCX + 8) != 1 &&
      ((((*(int *)(in_RCX + 8) != 3 && (*(int *)(in_RCX + 8) != 4)) && (*(int *)(in_RCX + 8) != 5))
       && (*(int *)(in_RCX + 8) != 0xe)))))) {
    std::__cxx11::string::string(local_88,in_R9);
    uVar3 = AddBodyMultiDofJoint
                      (in_stack_fffffffffffff798,in_stack_fffffffffffff794,in_stack_fffffffffffff788
                       ,in_stack_fffffffffffff780,in_stack_fffffffffffff778,
                       in_stack_fffffffffffff770);
    *(uint *)(in_RDI + 0x54) = uVar3;
    std::__cxx11::string::~string(local_88);
    return *(uint *)(in_RDI + 0x54);
  }
  local_8c = in_ESI;
  local_28 = in_RCX;
  local_14 = in_ESI;
  Math::SpatialTransform::SpatialTransform(in_stack_fffffffffffff130);
  bVar2 = IsFixedBodyId((Model *)in_stack_fffffffffffff128._M_current,
                        (uint)((ulong)in_stack_fffffffffffff120 >> 0x20));
  if (bVar2) {
    local_f4 = local_14 - *(int *)(in_RDI + 0x318);
    pvVar4 = std::
             vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
             ::operator[]((vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                           *)(in_RDI + 0x300),(ulong)local_f4);
    local_8c = pvVar4->mMovableParent;
    std::
    vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>::
    operator[]((vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                *)(in_RDI + 0x300),(ulong)local_f4);
    Math::SpatialTransform::operator=(in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff120,
             &(in_stack_fffffffffffff118._M_current)->first);
  sVar5 = std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
          ::size((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  *)(in_RDI + 0xa0));
  pvVar6 = std::
           vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
           operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                       *)(in_RDI + 0xa0),sVar5 - 1);
  local_f8 = pvVar6->q_index;
  sVar5 = std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
          ::size((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  *)(in_RDI + 0xa0));
  pvVar6 = std::
           vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
           operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                       *)(in_RDI + 0xa0),sVar5 - 1);
  if (pvVar6->mDoFCount != 0) {
    in_stack_fffffffffffff298 =
         (vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_> *)
         (in_RDI + 0xa0);
    sVar5 = std::
            vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
            size((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  *)(in_RDI + 0xa0));
    pvVar6 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[](in_stack_fffffffffffff298,sVar5 - 1);
    if (pvVar6->mJointType != JointTypeCustom) {
      in_stack_fffffffffffff288 = (Matrix3d *)(in_RDI + 0xa0);
      in_stack_fffffffffffff294 = local_f8;
      sVar5 = std::
              vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
              ::size((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                      *)(in_RDI + 0xa0));
      pvVar6 = std::
               vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                             *)in_stack_fffffffffffff288,sVar5 - 1);
      local_f8 = in_stack_fffffffffffff294 + pvVar6->mDoFCount;
      goto LAB_008488f0;
    }
  }
  sVar5 = std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
          ::size((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  *)(in_RDI + 0xa0));
  pvVar6 = std::
           vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
           operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                       *)(in_RDI + 0xa0),sVar5 - 1);
  if (pvVar6->mJointType == JointTypeCustom) {
    sVar5 = std::
            vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
            size((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  *)(in_RDI + 0xa0));
    pvVar6 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)(in_RDI + 0xa0),sVar5 - 1);
    uVar3 = local_f8;
    local_fc = pvVar6->custom_joint_index;
    sVar5 = std::
            vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
            ::size((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                    *)(in_RDI + 0x1c0));
    ppCVar7 = std::
              vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
              ::operator[]((vector<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                            *)(in_RDI + 0x1c0),sVar5 - 1);
    local_f8 = uVar3 + *(int *)(*ppCVar7 + 8);
  }
LAB_008488f0:
  for (local_100 = 0; local_100 < *(uint *)(local_28 + 0xc); local_100 = local_100 + 1) {
    local_104 = local_f8 + local_100;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff110,
               (value_type_conflict *)in_stack_fffffffffffff108);
  }
  local_128 = 0;
  uStack_120 = 0;
  local_118 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x848990);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)in_stack_fffffffffffff110,(value_type *)in_stack_fffffffffffff108);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff120);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::at((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        *)in_stack_fffffffffffff110,(size_type)in_stack_fffffffffffff108);
  sVar5 = std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
          size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                *)(in_RDI + 800));
  local_12c = (undefined4)sVar5;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff110,
             (value_type_conflict *)in_stack_fffffffffffff108);
  Math::SpatialTransform::SpatialTransform(in_stack_fffffffffffff130);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::push_back((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               *)in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  Math::SpatialTransform::SpatialTransform(in_stack_fffffffffffff130);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::push_back((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               *)in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
  push_back(in_stack_fffffffffffff120,(value_type *)in_stack_fffffffffffff118._M_current);
  lVar8 = std::__cxx11::string::size();
  if (lVar8 != 0) {
    local_1f8[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 *)in_stack_fffffffffffff108,(key_type *)0x848ac5);
    local_200._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                *)in_stack_fffffffffffff108);
    bVar2 = std::operator!=(local_1f8,&local_200);
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream(local_378);
      poVar12 = std::operator<<((ostream *)local_378,"Error: Body with name \'");
      poVar12 = std::operator<<(poVar12,in_R9);
      poVar12 = std::operator<<(poVar12,"\' already exists!");
      std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
      local_399 = 1;
      uVar13 = __cxa_allocate_exception(0x28);
      std::__cxx11::ostringstream::str();
      Errors::RBDLError::RBDLError
                ((RBDLError *)in_stack_fffffffffffff130,
                 (string *)in_stack_fffffffffffff128._M_current);
      local_399 = 0;
      __cxa_throw(uVar13,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
    }
    sVar5 = std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
            ::size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    *)(in_RDI + 800));
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::operator[](in_stack_fffffffffffff150,in_stack_fffffffffffff148);
    *pmVar9 = (int)sVar5 - 1;
  }
  local_408[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
  local_408[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
  local_408[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
  local_408[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
  local_408[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
  local_408[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
  pvVar16 = local_408;
  SpatialVector_t::SpatialVector_t
            (in_stack_fffffffffffff190,in_stack_fffffffffffff188,in_stack_fffffffffffff180,
             in_stack_fffffffffffff178,in_stack_fffffffffffff170,in_stack_fffffffffffff168,
             (double *)CONCAT44(in_stack_fffffffffffff1a4,in_stack_fffffffffffff1a0));
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             in_stack_fffffffffffff110,pvVar16);
  local_468[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
  local_468[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
  local_468[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
  local_468[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
  local_468[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
  local_468[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
  pvVar16 = local_468;
  SpatialVector_t::SpatialVector_t
            (in_stack_fffffffffffff190,in_stack_fffffffffffff188,in_stack_fffffffffffff180,
             in_stack_fffffffffffff178,in_stack_fffffffffffff170,in_stack_fffffffffffff168,
             (double *)CONCAT44(in_stack_fffffffffffff1a4,in_stack_fffffffffffff1a0));
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             in_stack_fffffffffffff110,pvVar16);
  sVar5 = std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
          ::size((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  *)(in_RDI + 0xa0));
  local_46c = (int)sVar5 - 1;
  std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
  push_back((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_> *
            )in_stack_fffffffffffff120,(value_type *)in_stack_fffffffffffff118._M_current);
  pvVar6 = std::
           vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
           operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                       *)(in_RDI + 0xa0),(ulong)local_46c);
  if (pvVar6->mJointType == JointTypeCustom) {
    pvVar6 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)(in_RDI + 0xa0),(ulong)local_46c);
    in_stack_fffffffffffff1dc = pvVar6->q_index;
    pvVar6 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)(in_RDI + 0xa0),(ulong)local_46c);
    uVar3 = in_stack_fffffffffffff1dc + pvVar6->mDoFCount;
    sVar5 = std::
            vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
            size((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  *)(in_RDI + 0xa0));
    pvVar6 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)(in_RDI + 0xa0),sVar5 - 1);
    pvVar6->q_index = uVar3;
  }
  else {
    pvVar6 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)(in_RDI + 0xa0),(ulong)local_46c);
    uVar3 = pvVar6->q_index;
    pvVar6 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)(in_RDI + 0xa0),(ulong)local_46c);
    uVar1 = pvVar6->mDoFCount;
    sVar5 = std::
            vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
            size((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  *)(in_RDI + 0xa0));
    pvVar6 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)(in_RDI + 0xa0),sVar5 - 1);
    pvVar6->q_index = uVar3 + uVar1;
  }
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             in_stack_fffffffffffff120,(value_type *)in_stack_fffffffffffff118._M_current);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             in_stack_fffffffffffff120,(value_type *)in_stack_fffffffffffff118._M_current);
  local_4d8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[5] = 0.0;
  local_4d8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[4] = 0.0;
  local_4d8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[3] = 0.0;
  local_4d8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[2] = 0.0;
  local_4d8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[1] = 0.0;
  local_4d8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[0] = 0.0;
  __x = &local_4d8;
  SpatialVector_t::SpatialVector_t
            (in_stack_fffffffffffff190,in_stack_fffffffffffff188,in_stack_fffffffffffff180,
             in_stack_fffffffffffff178,in_stack_fffffffffffff170,in_stack_fffffffffffff168,
             (double *)CONCAT44(in_stack_fffffffffffff1a4,in_stack_fffffffffffff1a0));
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             in_stack_fffffffffffff110,(value_type *)__x);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::Zero();
  Eigen::Matrix<double,6,3,0,6,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,3,0,6,3>>>
            ((Matrix<double,_6,_3,_0,_6,_3> *)in_stack_fffffffffffff110,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
              *)__x);
  std::
  vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
  ::push_back((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
               *)in_stack_fffffffffffff110,(value_type *)__x);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::Zero();
  Eigen::Matrix<double,6,3,0,6,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,3,0,6,3>>>
            ((Matrix<double,_6,_3,_0,_6,_3> *)in_stack_fffffffffffff110,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
              *)__x);
  std::
  vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
  ::push_back((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
               *)in_stack_fffffffffffff110,(value_type *)__x);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero();
  Matrix3_t::
  Matrix3_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            (&in_stack_fffffffffffff110->E,
             (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)__x);
  std::vector<Matrix3_t,_std::allocator<Matrix3_t>_>::push_back
            ((vector<Matrix3_t,_std::allocator<Matrix3_t>_> *)in_stack_fffffffffffff110,&__x->E);
  XT = (SpatialTransform *)(in_RDI + 400);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Vector3_t::
  Vector3_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Vector3_t *)in_stack_fffffffffffff110,
             (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)__x);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::push_back
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)in_stack_fffffffffffff110,
             (value_type *)__x);
  local_69c = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff110,
             (value_type_conflict *)__x);
  *(int *)(in_RDI + 0x48) = *(int *)(in_RDI + 0x48) + *(int *)(local_28 + 0xc);
  local_6a0 = 0;
  local_6a4 = 0;
  for (local_6a8 = 1; uVar10 = (ulong)local_6a8,
      sVar5 = std::
              vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
              ::size((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                      *)(in_RDI + 0xa0)), uVar10 < sVar5; local_6a8 = local_6a8 + 1) {
    pvVar6 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)(in_RDI + 0xa0),(ulong)local_6a8);
    if (pvVar6->mJointType == JointTypeSpherical) {
      in_stack_fffffffffffff1a4 = *(int *)(in_RDI + 0x48) + local_6a0;
      pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x1a8),
                           (ulong)local_6a8);
      *pvVar11 = in_stack_fffffffffffff1a4;
      local_6a0 = local_6a0 + 1;
    }
  }
  *(int *)(in_RDI + 0x4c) = *(int *)(in_RDI + 0x48) + local_6a0;
  *(int *)(in_RDI + 0x50) = *(int *)(in_RDI + 0x50) + *(int *)(local_28 + 0xc);
  Math::SpatialTransform::operator*
            ((SpatialTransform *)CONCAT44(in_stack_fffffffffffff1dc,in_stack_fffffffffffff1d8),XT);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::push_back((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               *)in_stack_fffffffffffff110,__x);
  v4 = (double *)(in_RDI + 0x1d8);
  local_740 = 0;
  local_748 = 0;
  local_750 = 0;
  local_758 = 0;
  local_760 = 0;
  local_768 = 0;
  other = (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>_>
           *)&local_768;
  SpatialVector_t::SpatialVector_t
            (in_stack_fffffffffffff190,in_stack_fffffffffffff188,in_stack_fffffffffffff180,
             in_stack_fffffffffffff178,in_stack_fffffffffffff170,v4,
             (double *)CONCAT44(in_stack_fffffffffffff1a4,in_stack_fffffffffffff1a0));
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             in_stack_fffffffffffff110,(value_type *)other);
  v3 = (double *)(in_RDI + 0x1f0);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::Zero();
  SpatialMatrix_t::
  SpatialMatrix_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,6,0,6,6>>>
            ((SpatialMatrix_t *)in_stack_fffffffffffff110,other);
  std::vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>::push_back
            ((vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_> *)
             in_stack_fffffffffffff110,(value_type *)other);
  v2 = (double *)(in_RDI + 0x208);
  local_8f8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
  local_8f8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
  local_8f8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
  local_8f8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
  local_8f8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
  local_8f8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
  pvVar16 = local_8f8;
  SpatialVector_t::SpatialVector_t
            (in_stack_fffffffffffff190,in_stack_fffffffffffff188,in_stack_fffffffffffff180,v2,v3,v4,
             (double *)CONCAT44(in_stack_fffffffffffff1a4,in_stack_fffffffffffff1a0));
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             in_stack_fffffffffffff110,pvVar16);
  v1 = (double *)(in_RDI + 0x220);
  local_930 = 0;
  local_938 = 0;
  local_940 = 0;
  local_948 = 0;
  local_950 = 0;
  local_958 = 0;
  other_00 = (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_958;
  SpatialVector_t::SpatialVector_t
            (in_stack_fffffffffffff190,in_stack_fffffffffffff188,v1,v2,v3,v4,
             (double *)CONCAT44(in_stack_fffffffffffff1a4,in_stack_fffffffffffff1a0));
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             in_stack_fffffffffffff110,(value_type *)other_00);
  std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::size
            ((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_> *)
             (in_RDI + 800));
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
            ((Index)in_stack_fffffffffffff118._M_current);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff110,other_00);
  std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::size
            ((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_> *)
             (in_RDI + 800));
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
            ((Index)in_stack_fffffffffffff118._M_current);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff110,other_00);
  v0 = (double *)(in_RDI + 600);
  local_9e8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
  local_9e8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
  local_9e8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
  local_9e8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
  local_9e8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
  local_9e8[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
  pvVar16 = local_9e8;
  SpatialVector_t::SpatialVector_t
            (in_stack_fffffffffffff190,v0,v1,v2,v3,v4,
             (double *)CONCAT44(in_stack_fffffffffffff1a4,in_stack_fffffffffffff1a0));
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             in_stack_fffffffffffff110,pvVar16);
  Math::SpatialRigidBodyInertia::createFromMassComInertiaC
            ((Scalar)in_stack_fffffffffffff298,
             (Vector3d *)CONCAT44(in_stack_fffffffffffff294,in_stack_fffffffffffff290),
             in_stack_fffffffffffff288);
  std::
  vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
  ::push_back((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
               *)in_stack_fffffffffffff120,(value_type *)in_stack_fffffffffffff118._M_current);
  std::
  vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
  ::push_back((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
               *)in_stack_fffffffffffff120,(value_type *)in_stack_fffffffffffff118._M_current);
  this_00 = (SpatialVector_t *)(in_RDI + 0x2a0);
  local_a98[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
  local_a98[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
  local_a98[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
  local_a98[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
  local_a98[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
  local_a98[0].super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
  pvVar16 = local_a98;
  SpatialVector_t::SpatialVector_t
            (this_00,v0,v1,v2,v3,v4,
             (double *)CONCAT44(in_stack_fffffffffffff1a4,in_stack_fffffffffffff1a0));
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             in_stack_fffffffffffff110,pvVar16);
  local_ad0 = 0;
  local_ad8 = 0;
  local_ae0 = 0;
  local_ae8 = 0;
  local_af0 = 0;
  local_af8.first = JointTypeUndefined;
  local_af8.second = 0;
  __x_00 = &local_af8;
  SpatialVector_t::SpatialVector_t
            (this_00,v0,v1,v2,v3,v4,
             (double *)CONCAT44(in_stack_fffffffffffff1a4,in_stack_fffffffffffff1a0));
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             in_stack_fffffffffffff110,(value_type *)__x_00);
  sVar5 = std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
          size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                *)(in_RDI + 800));
  if (sVar5 != *(uint *)(in_RDI + 0x318)) {
    sVar5 = std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
            ::size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    *)(in_RDI + 800));
    *(int *)(in_RDI + 0x54) = (int)sVar5 + -1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x849a87);
    std::
    vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
    ::vector((vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
              *)0x849a94);
    local_cb4 = 0;
    while( true ) {
      uVar10 = (ulong)local_cb4;
      sVar5 = std::
              vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
              ::size((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                      *)(in_RDI + 0xa0));
      if (sVar5 <= uVar10) break;
      pvVar6 = std::
               vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                             *)(in_RDI + 0xa0),(ulong)local_cb4);
      std::pair<RigidBodyDynamics::JointType,_unsigned_int>::
      pair<RigidBodyDynamics::JointType_&,_unsigned_int_&,_true>
                (&local_cbc,&pvVar6->mJointType,&local_cb4);
      std::
      vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
      ::push_back((vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
                   *)in_stack_fffffffffffff110,__x_00);
      in_stack_fffffffffffff128._M_current =
           (pair<RigidBodyDynamics::JointType,_unsigned_int> *)(in_RDI + 0x100);
      pvVar6 = std::
               vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ::operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                             *)(in_RDI + 0xa0),(ulong)local_cb4);
      local_cc0 = pvVar6->mJointType;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff110,
                 &__x_00->first);
      local_cb4 = local_cb4 + 1;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x849bbd);
    local_cc4 = JointTypeUndefined;
    while (sVar5 = std::
                   vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
                   ::size(&local_cb0), sVar5 != 0) {
      pvVar14 = std::
                vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
                ::operator[](&local_cb0,0);
      local_cc4 = pvVar14->first;
      local_cd0._M_current =
           (pair<RigidBodyDynamics::JointType,_unsigned_int> *)
           std::
           vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
           ::begin((vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
                    *)__x_00);
      while( true ) {
        std::
        vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
        ::end((vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
               *)__x_00);
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_*,_std::vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>_>
                            *)in_stack_fffffffffffff110,
                           (__normal_iterator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_*,_std::vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>_>
                            *)__x_00);
        if (!bVar2) break;
        ppVar15 = __gnu_cxx::
                  __normal_iterator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_*,_std::vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>_>
                  ::operator->(&local_cd0);
        if (ppVar15->first == local_cc4) {
          in_stack_fffffffffffff120 =
               (vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                *)(in_RDI + 0x100);
          __gnu_cxx::
          __normal_iterator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_*,_std::vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>_>
          ::operator->(&local_cd0);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffff120,&(in_stack_fffffffffffff118._M_current)->first);
          __gnu_cxx::
          __normal_iterator<std::pair<RigidBodyDynamics::JointType,unsigned_int>const*,std::vector<std::pair<RigidBodyDynamics::JointType,unsigned_int>,std::allocator<std::pair<RigidBodyDynamics::JointType,unsigned_int>>>>
          ::__normal_iterator<std::pair<RigidBodyDynamics::JointType,unsigned_int>*>
                    ((__normal_iterator<const_std::pair<RigidBodyDynamics::JointType,_unsigned_int>_*,_std::vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>_>
                      *)in_stack_fffffffffffff110,
                     (__normal_iterator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_*,_std::vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>_>
                      *)__x_00);
          in_stack_fffffffffffff118 =
               std::
               vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
               ::erase((vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
                        *)in_stack_fffffffffffff120,in_stack_fffffffffffff128);
          local_cd0._M_current = in_stack_fffffffffffff118._M_current;
        }
        else {
          __gnu_cxx::
          __normal_iterator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_*,_std::vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>_>
          ::operator++(&local_cd0);
        }
      }
    }
    local_4 = *(uint *)(in_RDI + 0x54);
    std::
    vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
    ::~vector((vector<std::pair<RigidBodyDynamics::JointType,_unsigned_int>,_std::allocator<std::pair<RigidBodyDynamics::JointType,_unsigned_int>_>_>
               *)in_stack_fffffffffffff120);
    return local_4;
  }
  this_01 = local_c70;
  std::__cxx11::ostringstream::ostringstream(this_01);
  poVar12 = std::operator<<((ostream *)this_01,"Error: cannot add more than ");
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,*(uint *)(in_RDI + 0x318));
  poVar12 = std::operator<<(poVar12,
                            " movable bodies. You need to modify Model::fixed_body_discriminator for this."
                           );
  std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
  local_c91 = 1;
  uVar13 = __cxa_allocate_exception(0x28);
  std::__cxx11::ostringstream::str();
  Errors::RBDLError::RBDLError
            ((RBDLError *)in_stack_fffffffffffff130,(string *)in_stack_fffffffffffff128._M_current);
  local_c91 = 0;
  __cxa_throw(uVar13,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
}

Assistant:

unsigned int Model::AddBody(
  const unsigned int parent_id,
  const SpatialTransform &joint_frame,
  const Joint &joint,
  const Body &body,
  std::string body_name)
{
  assert (lambda.size() > 0);
  assert (joint.mJointType != JointTypeUndefined);

  if (joint.mJointType == JointTypeFixed) {
    previously_added_body_id = AddBodyFixedJoint (*this,
                               parent_id,
                               joint_frame,
                               joint,
                               body,
                               body_name);

    return previously_added_body_id;
  } else if ( (joint.mJointType == JointTypeSpherical)
      || (joint.mJointType == JointTypeEulerZYX) 
      || (joint.mJointType == JointTypeEulerXYZ) 
      || (joint.mJointType == JointTypeEulerYXZ) 
      || (joint.mJointType == JointTypeEulerZXY) 
      || (joint.mJointType == JointTypeTranslationXYZ) 
      || (joint.mJointType == JointTypeCustom) 
      ) {
    // no action required
  } else if (joint.mJointType != JointTypePrismatic
             && joint.mJointType != JointTypeRevolute
             && joint.mJointType != JointTypeRevoluteX
             && joint.mJointType != JointTypeRevoluteY
             && joint.mJointType != JointTypeRevoluteZ
             && joint.mJointType != JointTypeHelical
            ) {
    previously_added_body_id = AddBodyMultiDofJoint (*this,
                               parent_id,
                               joint_frame,
                               joint,
                               body,
                               body_name);
    return previously_added_body_id;
  }

  // If we add the body to a fixed body we have to make sure that we
  // actually add it to its movable parent.
  unsigned int movable_parent_id = parent_id;
  SpatialTransform movable_parent_transform;

  if (IsFixedBodyId(parent_id)) {
    unsigned int fbody_id = parent_id - fixed_body_discriminator;
    movable_parent_id = mFixedBodies[fbody_id].mMovableParent;
    movable_parent_transform = mFixedBodies[fbody_id].mParentTransform;
  }

  // structural information
  lambda.push_back(movable_parent_id);
  unsigned int lambda_q_last = mJoints[mJoints.size() - 1].q_index;

  if (mJoints[mJoints.size() - 1].mDoFCount > 0
      && mJoints[mJoints.size() - 1].mJointType != JointTypeCustom) {
    lambda_q_last = lambda_q_last + mJoints[mJoints.size() - 1].mDoFCount;
  } else if (mJoints[mJoints.size() - 1].mJointType == JointTypeCustom) {
    unsigned int custom_index = mJoints[mJoints.size() - 1].custom_joint_index;
    lambda_q_last = lambda_q_last
                    + mCustomJoints[mCustomJoints.size() - 1]->mDoFCount;
  }

  for (unsigned int i = 0; i < joint.mDoFCount; i++) {
    lambda_q.push_back(lambda_q_last + i);
  }
  mu.push_back(std::vector<unsigned int>());
  mu.at(movable_parent_id).push_back(mBodies.size());

  // Bodies
  X_lambda.push_back(SpatialTransform());
  X_base.push_back(SpatialTransform());
  mBodies.push_back(body);

  if (body_name.size() != 0) {
    if (mBodyNameMap.find(body_name) != mBodyNameMap.end()) {
      std::ostringstream errormsg;
      errormsg << "Error: Body with name '"
               << body_name
               << "' already exists!"
               << std::endl;
      throw Errors::RBDLError(errormsg.str());
    }
    mBodyNameMap[body_name] = mBodies.size() - 1;
  }

  // state information
  v.push_back(SpatialVector(0., 0., 0., 0., 0., 0.));
  a.push_back(SpatialVector(0., 0., 0., 0., 0., 0.));

  // Joints
  unsigned int prev_joint_index = mJoints.size() - 1;
  mJoints.push_back(joint);

  if (mJoints[prev_joint_index].mJointType != JointTypeCustom) {
    mJoints[mJoints.size() - 1].q_index =
      mJoints[prev_joint_index].q_index + mJoints[prev_joint_index].mDoFCount;
  } else {
    mJoints[mJoints.size() - 1].q_index =
      mJoints[prev_joint_index].q_index + mJoints[prev_joint_index].mDoFCount;
  }

  S.push_back (joint.mJointAxes[0]);

  // Joint state variables
  v_J.push_back (joint.mJointAxes[0]);
  c_J.push_back (SpatialVector(0., 0., 0., 0., 0., 0.));

  // workspace for joints with 3 dof
  multdof3_S.push_back (Matrix63::Zero());
  multdof3_U.push_back (Matrix63::Zero());
  multdof3_Dinv.push_back (Matrix3d::Zero());
  multdof3_u.push_back (Vector3d::Zero());
  multdof3_w_index.push_back (0);

  dof_count = dof_count + joint.mDoFCount;

  // update the w components of the Quaternions. They are stored at the end
  // of the q vector
  int multdof3_joint_counter = 0;
  int mCustomJoint_joint_counter = 0;
  for (unsigned int i = 1; i < mJoints.size(); i++) {
    if (mJoints[i].mJointType == JointTypeSpherical) {
      multdof3_w_index[i] = dof_count + multdof3_joint_counter;
      multdof3_joint_counter++;
    }
  }

  q_size = dof_count
           + multdof3_joint_counter;

  qdot_size = qdot_size + joint.mDoFCount;

  // we have to invert the transformation as it is later always used from the
  // child bodies perspective.
  X_T.push_back(joint_frame * movable_parent_transform);

  // Dynamic variables
  c.push_back(SpatialVector(0., 0., 0., 0., 0., 0.));
  IA.push_back(SpatialMatrix::Zero());
  pA.push_back(SpatialVector(0., 0., 0., 0., 0., 0.));
  U.push_back(SpatialVector(0., 0., 0., 0., 0., 0.));

  d = VectorNd::Zero (mBodies.size());
  u = VectorNd::Zero (mBodies.size());

  f.push_back (SpatialVector (0., 0., 0., 0., 0., 0.));

  SpatialRigidBodyInertia rbi =
    SpatialRigidBodyInertia::createFromMassComInertiaC (body.mMass,
        body.mCenterOfMass,
        body.mInertia);

  Ic.push_back (rbi);
  I.push_back (rbi);
  hc.push_back (SpatialVector(0., 0., 0., 0., 0., 0.));
  hdotc.push_back (SpatialVector(0., 0., 0., 0., 0., 0.));

  if (mBodies.size() == fixed_body_discriminator) {
    std::ostringstream errormsg;
    errormsg << "Error: cannot add more than "
             << fixed_body_discriminator
             <<  " movable bodies. You need to modify Model::fixed_body_discriminator for this."
             << std::endl;
    throw Errors::RBDLError(errormsg.str());
  }

  previously_added_body_id = mBodies.size() - 1;

  mJointUpdateOrder.clear();

  // update the joint order computation
  std::vector<std::pair<JointType, unsigned int> > joint_types;
  for (unsigned int i = 0; i < mJoints.size(); i++) {
    joint_types.push_back(
      std::pair<JointType, unsigned int> (mJoints[i].mJointType,i));
    mJointUpdateOrder.push_back (mJoints[i].mJointType);
  }

  mJointUpdateOrder.clear();
  JointType current_joint_type = JointTypeUndefined;
  while (joint_types.size() != 0) {
    current_joint_type = joint_types[0].first;

    std::vector<std::pair<JointType, unsigned int> >::iterator type_iter =
      joint_types.begin();

    while (type_iter != joint_types.end()) {
      if (type_iter->first == current_joint_type) {
        mJointUpdateOrder.push_back (type_iter->second);
        type_iter = joint_types.erase (type_iter);
      } else {
        ++type_iter;
      }
    }
  }

  //  for (unsigned int i = 0; i < mJointUpdateOrder.size(); i++) {
  //    std::cout << "i = " << i << ": joint_id = " << mJointUpdateOrder[i]
  // << " joint_type = " << mJoints[mJointUpdateOrder[i]].mJointType << std::endl;
  //  }

  return previously_added_body_id;
}